

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print_test.cpp
# Opt level: O2

void __thiscall
StringPrintf_Precision_Test::~StringPrintf_Precision_Test(StringPrintf_Precision_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(StringPrintf, Precision) {
    double_conversion::StringToDoubleConverter floatParser(
        double_conversion::StringToDoubleConverter::ALLOW_HEX,
        0. /* empty string value */, 0. /* junk string value */,
        nullptr /* infinity symbol */, nullptr /* NaN symbol */);

    std::string pi = StringPrintf("%f", float(Pi));
    int length;
    float val = floatParser.StringToFloat(pi.data(), pi.size(), &length);
    EXPECT_NE(0, length);
    EXPECT_EQ(val, Pi);

    std::string e = StringPrintf("%f", std::exp(1.));
    double dval = floatParser.StringToDouble(e.data(), e.size(), &length);
    EXPECT_NE(0, length);
    EXPECT_EQ(dval, std::exp(1.));
}